

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorPool::TryFindSymbolInFallbackDatabase
          (DescriptorPool *this,string_view name,DeferredValidation *deferred_validation)

{
  DescriptorDatabase *pDVar1;
  string_view name_00;
  bool bVar2;
  int iVar3;
  FileDescriptorProto *proto;
  undefined8 *puVar4;
  FileDescriptor *pFVar5;
  FileDescriptorProto *__old_val;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar6;
  string_view key;
  iterator iVar7;
  key_arg<std::basic_string_view<char>_> local_60;
  long *local_50 [2];
  long local_40 [2];
  
  local_60._M_str = name._M_str;
  local_60._M_len = name._M_len;
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    return false;
  }
  this_00 = &((this->tables_)._M_t.
              super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
              .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl
             )->known_bad_symbols_;
  iVar7 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
          ::find<std::basic_string_view<char,std::char_traits<char>>>
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                      *)this_00,&local_60);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::AssertNotDebugCapacity
            (&this_00->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  if (iVar7.ctrl_ != (ctrl_t *)0x0) {
    return false;
  }
  proto = deferred_validation->first_proto_;
  if (proto == (FileDescriptorProto *)0x0) {
    proto = (FileDescriptorProto *)
            Arena::DefaultConstruct<google::protobuf::FileDescriptorProto>
                      (&deferred_validation->arena_);
  }
  else {
    deferred_validation->first_proto_ = (FileDescriptorProto *)0x0;
  }
  name_00._M_str = local_60._M_str;
  name_00._M_len = local_60._M_len;
  bVar2 = IsSubSymbolOfBuiltType(this,name_00);
  if (!bVar2) {
    pDVar1 = this->fallback_database_;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,local_60._M_str,local_60._M_str + local_60._M_len);
    iVar3 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,(string *)local_50,proto);
    if (((char)iVar3 != '\0') &&
       (puVar4 = (undefined8 *)
                 ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
       key._M_str = (char *)*puVar4, key._M_len = puVar4[1],
       pFVar5 = Tables::FindFile((this->tables_)._M_t.
                                 super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                 .
                                 super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                                 ._M_head_impl,key), pFVar5 == (FileDescriptor *)0x0)) {
      pFVar5 = BuildFileFromDatabase(this,proto,deferred_validation);
      bVar6 = pFVar5 != (FileDescriptor *)0x0;
      goto LAB_0014dcae;
    }
  }
  bVar6 = false;
LAB_0014dcae:
  if (bVar2) {
    return bVar6;
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
    return bVar6;
  }
  return bVar6;
}

Assistant:

bool DescriptorPool::TryFindSymbolInFallbackDatabase(
    absl::string_view name, DeferredValidation& deferred_validation) const {
  if (fallback_database_ == nullptr) return false;

  if (tables_->known_bad_symbols_.contains(name)) return false;

  auto& file_proto = deferred_validation.CreateProto();
  if (  // We skip looking in the fallback database if the name is a sub-symbol
        // of any descriptor that already exists in the descriptor pool (except
        // for package descriptors).  This is valid because all symbols except
        // for packages are defined in a single file, so if the symbol exists
        // then we should already have its definition.
        //
        // The other reason to do this is to support "overriding" type
        // definitions by merging two databases that define the same type. (Yes,
        // people do this.)  The main difficulty with making this work is that
        // FindFileContainingSymbol() is allowed to return both false positives
        // (e.g., SimpleDescriptorDatabase, UpgradedDescriptorDatabase) and
        // false negatives (e.g. ProtoFileParser, SourceTreeDescriptorDatabase).
        // When two such databases are merged, looking up a non-existent
        // sub-symbol of a type that already exists in the descriptor pool can
        // result in an attempt to load multiple definitions of the same type.
        // The check below avoids this.
      IsSubSymbolOfBuiltType(name)

      // Look up file containing this symbol in fallback database.
      || !fallback_database_->FindFileContainingSymbol(std::string(name),
                                                       &file_proto)

      // Check if we've already built this file. If so, it apparently doesn't
      // contain the symbol we're looking for.  Some DescriptorDatabases
      // return false positives.
      || tables_->FindFile(file_proto.name()) != nullptr

      // Build the file.
      || BuildFileFromDatabase(file_proto, deferred_validation) == nullptr) {
    return false;
  }

  return true;
}